

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O0

xmlTextWriterPtr xmlNewTextWriterPushParser(xmlParserCtxtPtr ctxt,int compression)

{
  xmlOutputBufferPtr out_00;
  xmlOutputBufferPtr out;
  xmlTextWriterPtr ret;
  int compression_local;
  xmlParserCtxtPtr ctxt_local;
  
  if (ctxt == (xmlParserCtxtPtr)0x0) {
    xmlWriterErrMsg((xmlTextWriterPtr)0x0,XML_ERR_INTERNAL_ERROR,
                    "xmlNewTextWriterPushParser : invalid context!\n");
    ctxt_local = (xmlParserCtxtPtr)0x0;
  }
  else {
    out_00 = xmlOutputBufferCreateIO
                       (xmlTextWriterWriteDocCallback,xmlTextWriterCloseDocCallback,ctxt,
                        (xmlCharEncodingHandlerPtr)0x0);
    if (out_00 == (xmlOutputBufferPtr)0x0) {
      xmlWriterErrMsg((xmlTextWriterPtr)0x0,XML_ERR_INTERNAL_ERROR,
                      "xmlNewTextWriterPushParser : error at xmlOutputBufferCreateIO!\n");
      ctxt_local = (xmlParserCtxtPtr)0x0;
    }
    else {
      ctxt_local = (xmlParserCtxtPtr)xmlNewTextWriter(out_00);
      if (ctxt_local == (xmlParserCtxtPtr)0x0) {
        xmlWriterErrMsg((xmlTextWriterPtr)0x0,XML_ERR_INTERNAL_ERROR,
                        "xmlNewTextWriterPushParser : error at xmlNewTextWriter!\n");
        xmlOutputBufferClose(out_00);
        ctxt_local = (xmlParserCtxtPtr)0x0;
      }
      else {
        ctxt_local->input = (xmlParserInputPtr)ctxt;
      }
    }
  }
  return (xmlTextWriterPtr)ctxt_local;
}

Assistant:

xmlTextWriterPtr
xmlNewTextWriterPushParser(xmlParserCtxtPtr ctxt,
                           int compression ATTRIBUTE_UNUSED)
{
    xmlTextWriterPtr ret;
    xmlOutputBufferPtr out;

    if (ctxt == NULL) {
        xmlWriterErrMsg(NULL, XML_ERR_INTERNAL_ERROR,
                        "xmlNewTextWriterPushParser : invalid context!\n");
        return NULL;
    }

    out = xmlOutputBufferCreateIO(xmlTextWriterWriteDocCallback,
                                  xmlTextWriterCloseDocCallback,
                                  (void *) ctxt, NULL);
    if (out == NULL) {
        xmlWriterErrMsg(NULL, XML_ERR_INTERNAL_ERROR,
                        "xmlNewTextWriterPushParser : error at xmlOutputBufferCreateIO!\n");
        return NULL;
    }

    ret = xmlNewTextWriter(out);
    if (ret == NULL) {
        xmlWriterErrMsg(NULL, XML_ERR_INTERNAL_ERROR,
                        "xmlNewTextWriterPushParser : error at xmlNewTextWriter!\n");
        xmlOutputBufferClose(out);
        return NULL;
    }

    ret->ctxt = ctxt;

    return ret;
}